

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCodeGeneratedColumn(Parse *pParse,Table *pTab,Column *pCol,int regOut)

{
  int iVar1;
  Vdbe *p;
  int addr;
  Expr *pExpr;
  
  p = pParse->pVdbe;
  iVar1 = pParse->nErr;
  if (pParse->iSelfTab < 1) {
    addr = 0;
  }
  else {
    addr = sqlite3VdbeAddOp3(p,0x14,pParse->iSelfTab + -1,0,regOut);
  }
  pExpr = sqlite3ColumnExpr(pTab,pCol);
  sqlite3ExprCodeCopy(pParse,pExpr,regOut);
  if ('A' < pCol->affinity) {
    sqlite3VdbeAddOp4(p,0x60,regOut,1,0,&pCol->affinity,1);
  }
  if (addr != 0) {
    sqlite3VdbeJumpHere(p,addr);
  }
  if (iVar1 < pParse->nErr) {
    pParse->db->errByteOffset = -1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeGeneratedColumn(
  Parse *pParse,     /* Parsing context */
  Table *pTab,       /* Table containing the generated column */
  Column *pCol,      /* The generated column */
  int regOut         /* Put the result in this register */
){
  int iAddr;
  Vdbe *v = pParse->pVdbe;
  int nErr = pParse->nErr;
  assert( v!=0 );
  assert( pParse->iSelfTab!=0 );
  if( pParse->iSelfTab>0 ){
    iAddr = sqlite3VdbeAddOp3(v, OP_IfNullRow, pParse->iSelfTab-1, 0, regOut);
  }else{
    iAddr = 0;
  }
  sqlite3ExprCodeCopy(pParse, sqlite3ColumnExpr(pTab,pCol), regOut);
  if( pCol->affinity>=SQLITE_AFF_TEXT ){
    sqlite3VdbeAddOp4(v, OP_Affinity, regOut, 1, 0, &pCol->affinity, 1);
  }
  if( iAddr ) sqlite3VdbeJumpHere(v, iAddr);
  if( pParse->nErr>nErr ) pParse->db->errByteOffset = -1;
}